

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

UninterpretedOption_NamePart *
google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>::New
          (Arena *arena)

{
  Arena *arena_local;
  UninterpretedOption_NamePart *local_28;
  UninterpretedOption_NamePart *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (UninterpretedOption_NamePart *)operator_new(0x28);
    UninterpretedOption_NamePart::UninterpretedOption_NamePart(local_28);
  }
  else {
    local_28 = (UninterpretedOption_NamePart *)
               Arena::AllocateAligned
                         (arena,(type_info *)&UninterpretedOption_NamePart::typeinfo,0x28);
    UninterpretedOption_NamePart::UninterpretedOption_NamePart(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<google::protobuf::UninterpretedOption_NamePart>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }